

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O2

Opnd * __thiscall IR::Instr::FindCallArgumentOpnd(Instr *this,ArgSlot argSlot,Instr **ownerInstrRef)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  StackSym *this_00;
  Opnd *this_01;
  
  bVar2 = OpCodeAttr::CallInstr(this->m_opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x543,"(OpCodeAttr::CallInstr(m_opcode))","OpCodeAttr::CallInstr(m_opcode)")
    ;
    if (!bVar2) goto LAB_00481bd1;
    *puVar4 = 0;
  }
  if (argSlot == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x544,"(argSlot != static_cast<Js::ArgSlot>(0))",
                       "argSlot != static_cast<Js::ArgSlot>(0)");
    if (!bVar2) goto LAB_00481bd1;
    *puVar4 = 0;
  }
  this_01 = this->m_src2;
  if (this_01 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x547,"(argInstr->GetSrc2())","argInstr->GetSrc2()");
    if (!bVar2) goto LAB_00481bd1;
    *puVar4 = 0;
    this_01 = this->m_src2;
  }
  bVar2 = Opnd::IsSymOpnd(this_01);
  if (bVar2) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x548,"(argInstr->GetSrc2()->IsSymOpnd())",
                       "argInstr->GetSrc2()->IsSymOpnd()");
    if (!bVar2) {
LAB_00481bd1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  do {
    pSVar5 = Opnd::AsSymOpnd(this->m_src2);
    this_00 = Sym::AsStackSym(pSVar5->m_sym);
    if (((this_00->field_0x18 & 1) == 0) || ((this_00->field_5).m_instrDef == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x54c,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar2) goto LAB_00481bd1;
      *puVar4 = 0;
    }
    bVar2 = StackSym::IsArgSlotSym(this_00);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x54d,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
      if (!bVar2) goto LAB_00481bd1;
      *puVar4 = 0;
    }
    this = (this_00->field_5).m_instrDef;
    if (this->m_src2 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x550,"(argInstr->GetSrc2())","argInstr->GetSrc2()");
      if (!bVar2) goto LAB_00481bd1;
      *puVar4 = 0;
    }
    if ((this->m_opcode != ArgOut_A_InlineSpecialized) &&
       (AVar3 = StackSym::GetArgSlotNum(this_00), AVar3 == argSlot)) {
      if (ownerInstrRef != (Instr **)0x0) {
        *ownerInstrRef = this;
      }
      return this->m_src1;
    }
    bVar2 = Opnd::IsSymOpnd(this->m_src2);
    if (!bVar2) {
      return (Opnd *)0x0;
    }
  } while( true );
}

Assistant:

Opnd *Instr::FindCallArgumentOpnd(const Js::ArgSlot argSlot, IR::Instr * *const ownerInstrRef)
{
    Assert(OpCodeAttr::CallInstr(m_opcode));
    Assert(argSlot != static_cast<Js::ArgSlot>(0));

    IR::Instr *argInstr = this;
    Assert(argInstr->GetSrc2());
    Assert(argInstr->GetSrc2()->IsSymOpnd());
    do
    {
        StackSym *const linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
        Assert(linkSym->IsSingleDef());
        Assert(linkSym->IsArgSlotSym());

        argInstr = linkSym->m_instrDef;
        Assert(argInstr->GetSrc2());
        if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
        {
            // This is a fake ArgOut, skip it
            continue;
        }

        if(linkSym->GetArgSlotNum() == argSlot)
        {
            if(ownerInstrRef)
            {
                *ownerInstrRef = argInstr;
            }
            return argInstr->GetSrc1();
        }
    } while(argInstr->GetSrc2()->IsSymOpnd());
    return nullptr;
}